

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffd2e(double dval,int decim,char *cval,int *status)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *cptr;
  int *status_local;
  char *cval_local;
  int decim_local;
  double dval_local;
  
  if (*status < 1) {
    *cval = '\0';
    if (decim < 0) {
      iVar1 = snprintf(cval,0x47,"%.*G",dval,(ulong)(uint)-decim);
      if (iVar1 < 0) {
        ffpmsg("Error in ffd2e converting float to string");
        *status = 0x192;
      }
      else {
        pcVar2 = strchr(cval,0x2e);
        if (((pcVar2 == (char *)0x0) && (pcVar2 = strchr(cval,0x2c), pcVar2 == (char *)0x0)) &&
           (pcVar2 = strchr(cval,0x45), pcVar2 != (char *)0x0)) {
          iVar1 = snprintf(cval,0x47,"%.1E",dval);
          if (iVar1 < 0) {
            ffpmsg("Error in ffd2e converting float to string");
            *status = 0x192;
          }
          pcVar2 = strchr(cval,0x2c);
          if (pcVar2 != (char *)0x0) {
            *pcVar2 = '.';
          }
          return *status;
        }
      }
    }
    else {
      iVar1 = snprintf(cval,0x47,"%.*E",dval,(ulong)(uint)decim);
      if (iVar1 < 0) {
        ffpmsg("Error in ffd2e converting float to string");
        *status = 0x192;
      }
    }
    if (*status < 1) {
      pcVar2 = strchr(cval,0x2c);
      if (pcVar2 != (char *)0x0) {
        *pcVar2 = '.';
      }
      pcVar2 = strchr(cval,0x4e);
      if (pcVar2 == (char *)0x0) {
        pcVar2 = strchr(cval,0x2e);
        if (((pcVar2 == (char *)0x0) && (pcVar2 = strchr(cval,0x45), pcVar2 == (char *)0x0)) &&
           (sVar3 = strlen(cval), sVar3 < 0x46)) {
          strcat(cval,".");
        }
      }
      else {
        ffpmsg("Error in ffd2e: double value is a NaN or INDEF");
        *status = 0x192;
      }
    }
    dval_local._4_4_ = *status;
  }
  else {
    dval_local._4_4_ = *status;
  }
  return dval_local._4_4_;
}

Assistant:

int ffd2e(double dval,  /* I - value to be converted to a string */
          int decim,    /* I - number of decimal places to display */
          char *cval,   /* O - character string representation of the value */
          int *status)  /* IO - error status */
/*
  convert double value to a null-terminated exponential format string.
*/
{
    char *cptr;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    cval[0] = '\0';

    if (decim < 0)
    {   /* use G format if decim is negative */
        if ( snprintf(cval, FLEN_VALUE,"%.*G", -decim, dval) < 0)
        {
            ffpmsg("Error in ffd2e converting float to string");
            *status = BAD_F2C;
        }
        else
        {
            /* test if E format was used, and there is no displayed decimal */
            /* If locale is French, decimal will be a comma. So look for that too. */
            if ( !strchr(cval, '.') && !strchr(cval, ',') && strchr(cval,'E') )
            {
                /* reformat value with a decimal point and single zero */
                if ( snprintf(cval, FLEN_VALUE,"%.1E", dval) < 0)
                {
                    ffpmsg("Error in ffd2e converting float to string");
                    *status = BAD_F2C;
                }
                /* convert French locale comma to a decimal point.*/
                if ((cptr = strchr(cval, ','))) *cptr = '.';

                return(*status);  
            }
        }
    }
    else
    {
        if ( snprintf(cval, FLEN_VALUE,"%.*E", decim, dval) < 0)
        {
            ffpmsg("Error in ffd2e converting float to string");
            *status = BAD_F2C;
        }
    }

    if (*status <= 0)
    {
        /* replace comma with a period (e.g. in French locale) */
        if ( (cptr = strchr(cval, ','))) *cptr = '.';

        /* test if output string is 'NaN', 'INDEF', or 'INF' */
        if (strchr(cval, 'N'))
        {
            ffpmsg("Error in ffd2e: double value is a NaN or INDEF");
            *status = BAD_F2C;
        }
        else if ( !strchr(cval, '.') && !strchr(cval,'E') && strlen(cval) < FLEN_VALUE-1)
        {
            /* add decimal point if necessary to distinquish from integer */
            strcat(cval, ".");
        }
    }

    return(*status);
}